

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetKeyboardFocusHere(int offset)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiDir move_dir;
  uint in_EDI;
  ImGuiScrollFlags scroll_flags;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiScrollFlags in_stack_ffffffffffffffd8;
  ImGuiNavMoveFlags in_stack_ffffffffffffffdc;
  ImGuiDir in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if ((GImGui->DebugLogFlags & 1U) != 0) {
    DebugLog("SetKeyboardFocusHere(%d) in window \"%s\"\n",(ulong)in_EDI,pIVar1->Name);
  }
  if (((pIVar2->DragDropActive & 1U) == 0) && (pIVar2->MovingWindow == (ImGuiWindow *)0x0)) {
    SetNavWindow((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    move_dir = 3;
    if ((pIVar1->Appearing & 1U) != 0) {
      move_dir = 0x21;
    }
    NavMoveRequestSubmit
              (move_dir,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
               in_stack_ffffffffffffffd8);
    if (in_EDI == 0xffffffff) {
      NavMoveRequestResolveWithLastItem
                ((ImGuiNavItemData *)CONCAT44(move_dir,in_stack_ffffffffffffffe0));
    }
    else {
      pIVar2->NavTabbingDir = 1;
      pIVar2->NavTabbingCounter = in_EDI + 1;
    }
  }
  else if ((pIVar2->DebugLogFlags & 1U) != 0) {
    DebugLog("SetKeyboardFocusHere() ignored while DragDropActive!\n");
  }
  return;
}

Assistant:

void ImGui::SetKeyboardFocusHere(int offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(offset >= -1);    // -1 is allowed but not below
    IMGUI_DEBUG_LOG_ACTIVEID("SetKeyboardFocusHere(%d) in window \"%s\"\n", offset, window->Name);

    // It makes sense in the vast majority of cases to never interrupt a drag and drop.
    // When we refactor this function into ActivateItem() we may want to make this an option.
    // MovingWindow is protected from most user inputs using SetActiveIdUsingNavAndKeys(), but
    // is also automatically dropped in the event g.ActiveId is stolen.
    if (g.DragDropActive || g.MovingWindow != NULL)
    {
        IMGUI_DEBUG_LOG_ACTIVEID("SetKeyboardFocusHere() ignored while DragDropActive!\n");
        return;
    }

    SetNavWindow(window);

    ImGuiScrollFlags scroll_flags = window->Appearing ? ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_KeepVisibleEdgeY;
    NavMoveRequestSubmit(ImGuiDir_None, offset < 0 ? ImGuiDir_Up : ImGuiDir_Down, ImGuiNavMoveFlags_Tabbing | ImGuiNavMoveFlags_FocusApi, scroll_flags); // FIXME-NAV: Once we refactor tabbing, add LegacyApi flag to not activate non-inputable.
    if (offset == -1)
    {
        NavMoveRequestResolveWithLastItem(&g.NavMoveResultLocal);
    }
    else
    {
        g.NavTabbingDir = 1;
        g.NavTabbingCounter = offset + 1;
    }
}